

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

uint32_t __thiscall
TS_program_map_section::serialize
          (TS_program_map_section *this,uint8_t *buffer,int max_buf_size,bool blurayMode,
          bool hdmvDescriptors)

{
  int iVar1;
  uint *puVar2;
  uint8_t *puVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  _Base_ptr p_Var8;
  undefined7 in_register_00000009;
  uint uVar9;
  int k;
  long lVar10;
  uint uVar11;
  undefined3 in_register_00000081;
  int iVar12;
  int iVar13;
  BitStreamWriter bitWriter;
  BitStreamWriter local_80;
  undefined4 local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  uint *local_48;
  uint8_t *local_40;
  _Rb_tree_node_base *local_38;
  
  iVar12 = CONCAT31(in_register_00000081,hdmvDescriptors);
  local_60 = (undefined4)CONCAT71(in_register_00000009,blurayMode);
  *buffer = '\0';
  local_80.super_BitStream.m_totalBits = 0;
  local_80.super_BitStream.m_buffer = (uint *)0x0;
  local_80.super_BitStream.m_initBuffer = (uint *)0x0;
  local_80.m_curVal = 0;
  local_80.m_bitWrited = 0;
  local_40 = buffer + 1;
  BitStream::setBuffer(&local_80.super_BitStream,local_40,buffer + (long)max_buf_size + 1);
  local_80.m_curVal = 0;
  local_80.m_bitWrited = 0;
  BitStreamWriter::putBits(&local_80,8,2);
  local_48 = local_80.super_BitStream.m_initBuffer;
  local_50 = (ulong)(((int)local_80.super_BitStream.m_buffer -
                     (int)local_80.super_BitStream.m_initBuffer) * 8 + local_80.m_bitWrited);
  BitStreamWriter::putBits(&local_80,2,2);
  BitStreamWriter::putBits(&local_80,2,3);
  BitStreamWriter::putBits(&local_80,0xc,0);
  local_58 = (ulong)(((int)local_80.super_BitStream.m_buffer -
                     (int)local_80.super_BitStream.m_initBuffer) * 8 + local_80.m_bitWrited);
  BitStreamWriter::putBits(&local_80,0x10,(uint)this->program_number);
  BitStreamWriter::putBits(&local_80,2,3);
  BitStreamWriter::putBits(&local_80,5,0);
  BitStreamWriter::putBits(&local_80,1,1);
  BitStreamWriter::putBits(&local_80,0x10,0);
  BitStreamWriter::putBits(&local_80,3,7);
  BitStreamWriter::putBits(&local_80,0xd,this->pcr_pid);
  puVar2 = local_80.super_BitStream.m_initBuffer;
  iVar5 = (int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer;
  iVar1 = local_80.m_bitWrited + iVar5 * 8;
  iVar5 = local_80.m_bitWrited + iVar5 * 8 + 7;
  if (-1 < iVar1) {
    iVar5 = iVar1;
  }
  BitStreamWriter::putBits(&local_80,4,0xf);
  BitStreamWriter::putBits(&local_80,0xc,0);
  iVar1 = local_80.m_bitWrited +
          ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer) * 8;
  iVar13 = local_80.m_bitWrited +
           ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer) * 8
           + 7;
  if (-1 < iVar1) {
    iVar13 = iVar1;
  }
  local_5c = iVar12;
  if (iVar12 != 0) {
    BitStreamWriter::putBits(&local_80,8,5);
    BitStreamWriter::putBits(&local_80,8,4);
    BitStreamWriter::putBits(&local_80,0x20,0x48444d56);
    BitStreamWriter::putBits(&local_80,8,0x88);
    BitStreamWriter::putBits(&local_80,8,4);
    BitStreamWriter::putBits(&local_80,0x20,0xffffcfc);
  }
  if (this->casPID != 0) {
    BitStreamWriter::putBits(&local_80,8,9);
    BitStreamWriter::putBits(&local_80,8,4);
    BitStreamWriter::putBits(&local_80,0x10,this->casID);
    BitStreamWriter::putBits(&local_80,0x10,this->casPID);
  }
  uVar9 = local_80.m_bitWrited +
          ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer) * 8;
  uVar6 = local_80.m_bitWrited +
          ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < (int)uVar9) {
    uVar6 = uVar9;
  }
  uVar4 = my_ntohs(((short)(uVar6 >> 3) - (short)(iVar13 >> 3)) - 0x1000);
  *(uint16_t *)((long)puVar2 + (long)(iVar5 >> 3)) = uVar4;
  if (this->video_pid != 0) {
    BitStreamWriter::putBits(&local_80,8,this->video_type);
    BitStreamWriter::putBits(&local_80,3,7);
    BitStreamWriter::putBits(&local_80,0xd,this->video_pid);
    BitStreamWriter::putBits(&local_80,4,0xf);
    BitStreamWriter::putBits(&local_80,0xc,0);
  }
  if (this->audio_pid != 0) {
    BitStreamWriter::putBits(&local_80,8,this->audio_type);
    BitStreamWriter::putBits(&local_80,3,7);
    BitStreamWriter::putBits(&local_80,0xd,this->audio_pid);
    BitStreamWriter::putBits(&local_80,4,0xf);
    BitStreamWriter::putBits(&local_80,0xc,0);
  }
  if (this->sub_pid != 0) {
    BitStreamWriter::putBits(&local_80,8,6);
    BitStreamWriter::putBits(&local_80,3,7);
    BitStreamWriter::putBits(&local_80,0xd,this->sub_pid);
    BitStreamWriter::putBits(&local_80,4,0xf);
    BitStreamWriter::putBits(&local_80,0xc,0);
  }
  p_Var8 = (this->pidList)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(this->pidList)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != local_38) {
    do {
      if (*(int *)&p_Var8[1]._M_parent == 0x90 && (char)local_5c == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Warning: PGS might not work without HDMV descriptors.",
                   0x35);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        sLastMsg = true;
      }
      BitStreamWriter::putBits(&local_80,8,*(uint *)&p_Var8[1]._M_parent);
      BitStreamWriter::putBits(&local_80,3,7);
      BitStreamWriter::putBits(&local_80,0xd,*(uint *)((long)&p_Var8[1]._M_parent + 4));
      puVar2 = local_80.super_BitStream.m_initBuffer;
      iVar5 = (int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer;
      iVar1 = local_80.m_bitWrited + iVar5 * 8;
      iVar5 = local_80.m_bitWrited + iVar5 * 8 + 7;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      BitStreamWriter::putBits(&local_80,4,0xf);
      BitStreamWriter::putBits(&local_80,0xc,0);
      iVar1 = local_80.m_bitWrited +
              ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer)
              * 8;
      iVar12 = local_80.m_bitWrited +
               ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer)
               * 8 + 7;
      if (-1 < iVar1) {
        iVar12 = iVar1;
      }
      if (0 < *(int *)&p_Var8[1]._M_left) {
        lVar10 = 0;
        do {
          BitStreamWriter::putBits(&local_80,8,(uint)*(byte *)((long)&p_Var8[1]._M_right + lVar10));
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)&p_Var8[1]._M_left);
      }
      if (*(char *)&p_Var8[5]._M_right != '\0' && (char)local_60 == '\0') {
        BitStreamWriter::putBits(&local_80,8,10);
        BitStreamWriter::putBits(&local_80,8,4);
        lVar10 = 0;
        do {
          BitStreamWriter::putBits(&local_80,8,(int)*(char *)((long)&p_Var8[5]._M_right + lVar10));
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        BitStreamWriter::putBits(&local_80,8,0);
      }
      uVar9 = local_80.m_bitWrited +
              ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer)
              * 8;
      uVar6 = local_80.m_bitWrited +
              ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer)
              * 8 + 7;
      if (-1 < (int)uVar9) {
        uVar6 = uVar9;
      }
      uVar4 = my_ntohs(((short)(uVar6 >> 3) - (short)(iVar12 >> 3)) - 0x1000);
      *(uint16_t *)((long)puVar2 + (long)(iVar5 >> 3)) = uVar4;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_38);
  }
  uVar9 = (uint)local_58;
  uVar6 = uVar9 + 7;
  if (-1 < (int)uVar9) {
    uVar6 = uVar9;
  }
  iVar1 = (int)local_50;
  iVar5 = iVar1 + 7;
  if (-1 < iVar1) {
    iVar5 = iVar1;
  }
  uVar9 = local_80.m_bitWrited +
          ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer) * 8;
  uVar11 = local_80.m_bitWrited +
           ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer) * 8
           + 7;
  if (-1 < (int)uVar9) {
    uVar11 = uVar9;
  }
  uVar4 = my_ntohs(((short)(uVar11 >> 3) - (short)(uVar6 >> 3)) + 0xb004);
  *(uint16_t *)((long)local_48 + (long)(iVar5 >> 3)) = uVar4;
  BitStreamWriter::flushBits(&local_80);
  puVar3 = local_40;
  uVar9 = local_80.m_bitWrited +
          ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer) * 8;
  uVar6 = local_80.m_bitWrited + 7 +
          ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer) * 8;
  if ((int)uVar9 < 0) {
    uVar9 = uVar6;
  }
  uVar11 = 0xffffffff;
  if (0xe < uVar6) {
    lVar10 = 0;
    uVar11 = 0xffffffff;
    do {
      uVar11 = uVar11 << 8 ^
               *(uint *)(calculateCRC32(unsigned_char_const*,unsigned_long,unsigned_int)::CRC32 +
                        (ulong)((uint)local_40[lVar10] ^ uVar11 >> 0x18) * 4);
      lVar10 = lVar10 + 1;
    } while ((int)uVar9 >> 3 != lVar10);
  }
  uVar7 = my_ntohl(uVar11);
  *(uint32_t *)(puVar3 + ((int)uVar9 >> 3)) = uVar7;
  iVar1 = local_80.m_bitWrited +
          ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer) * 8;
  iVar5 = local_80.m_bitWrited +
          ((int)local_80.super_BitStream.m_buffer - (int)local_80.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar1) {
    iVar5 = iVar1;
  }
  return (iVar5 >> 3) + 5;
}

Assistant:

uint32_t TS_program_map_section::serialize(uint8_t* buffer, const int max_buf_size, const bool blurayMode,
                                           const bool hdmvDescriptors)
{
    buffer[0] = 0;
    buffer++;
    BitStreamWriter bitWriter{};
    bitWriter.setBuffer(buffer, buffer + max_buf_size);
    bitWriter.putBits(8, 2);  // table id

    const auto LengthPos1 = reinterpret_cast<uint16_t*>(bitWriter.getBuffer() + bitWriter.getBitsCount() / 8);
    bitWriter.putBits(2, 2);   // indicator
    bitWriter.putBits(2, 3);   // reserved
    bitWriter.putBits(12, 0);  // length
    const unsigned beforeCount1 = bitWriter.getBitsCount() / 8;

    bitWriter.putBits(16, program_number);
    bitWriter.putBits(2, 3);         // reserved
    bitWriter.putBits(5, 0);         // version_number
    bitWriter.putBits(1, 1);         // current next indicator
    bitWriter.putBits(16, 0);        // section_number and last_section_number
    bitWriter.putBits(3, 7);         // reserved
    bitWriter.putBits(13, pcr_pid);  // reserved

    const auto LengthPos2 = reinterpret_cast<uint16_t*>(bitWriter.getBuffer() + bitWriter.getBitsCount() / 8);
    bitWriter.putBits(4, 15);  // reserved
    bitWriter.putBits(12, 0);  // program info len
    const unsigned beforeCount2 = bitWriter.getBitsCount() / 8;

    if (hdmvDescriptors)
    {
        // put 'HDMV' registration descriptor
        bitWriter.putBits(8, static_cast<uint8_t>(TSDescriptorTag::HDMV));
        bitWriter.putBits(8, 0x04);
        bitWriter.putBits(32, 0x48444d56);

        // put DTCP descriptor
        bitWriter.putBits(8, static_cast<uint8_t>(TSDescriptorTag::COPY_CONTROL));
        bitWriter.putBits(8, 0x04);
        bitWriter.putBits(32, 0x0ffffcfc);
    }

    if (casPID)
    {
        // put CAS descriptor
        bitWriter.putBits(8, static_cast<uint8_t>(TSDescriptorTag::CAS));
        bitWriter.putBits(8, 0x04);
        bitWriter.putBits(16, casID);
        bitWriter.putBits(16, casPID);
    }
    *LengthPos2 = my_htons(static_cast<uint16_t>(0xf000 + bitWriter.getBitsCount() / 8 - beforeCount2));

    if (video_pid)
    {
        bitWriter.putBits(8, video_type);
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, video_pid);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
    }

    if (audio_pid)
    {
        bitWriter.putBits(8, audio_type);
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, audio_pid);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
    }

    if (sub_pid)
    {
        bitWriter.putBits(8, static_cast<uint8_t>(StreamType::SUB_DVB));
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, sub_pid);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
    }

    for (const auto& [pid, si] : pidList)
    {
        if (si.m_streamType == StreamType::SUB_PGS && !hdmvDescriptors)
            LTRACE(LT_WARN, 2, "Warning: PGS might not work without HDMV descriptors.");

        bitWriter.putBits(8, static_cast<int>(si.m_streamType));
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, si.m_pid);

        const auto esInfoLen = reinterpret_cast<uint16_t*>(bitWriter.getBuffer() + bitWriter.getBitsCount() / 8);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
        const unsigned beforeCount = bitWriter.getBitsCount() / 8;

        for (int j = 0; j < si.m_esInfoLen; j++) bitWriter.putBits(8, si.m_esInfoData[j]);  // es_info_len

        if (*si.m_lang && !blurayMode)
        {
            bitWriter.putBits(8, static_cast<unsigned>(TSDescriptorTag::LANG));  // lang descriptor ID
            bitWriter.putBits(8, 4);                                             // lang descriptor len
            for (int k = 0; k < 3; k++) bitWriter.putBits(8, si.m_lang[k]);      // lang code[i]
            bitWriter.putBits(8, 0);
        }
        *esInfoLen = my_htons(static_cast<uint16_t>(0xf000 + bitWriter.getBitsCount() / 8 - beforeCount));
    }
    *LengthPos1 = my_htons(static_cast<uint16_t>(0xb000 + bitWriter.getBitsCount() / 8 - beforeCount1 + 4));
    bitWriter.flushBits();

    const uint32_t crc = calculateCRC32(buffer, bitWriter.getBitsCount() / 8);

    const auto crcPtr = reinterpret_cast<uint32_t*>(buffer + bitWriter.getBitsCount() / 8);
    *crcPtr = my_htonl(crc);

    return bitWriter.getBitsCount() / 8 + 5;
}